

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O0

int create_message_annotations_to_encode
              (IOTHUB_MESSAGE_HANDLE messageHandle,AMQP_VALUE *message_annotations,
              size_t *message_annotations_length)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  message_annotations pAStack_28;
  int result;
  AMQP_VALUE message_annotations_map;
  size_t *message_annotations_length_local;
  AMQP_VALUE *message_annotations_local;
  IOTHUB_MESSAGE_HANDLE messageHandle_local;
  
  pAStack_28 = (message_annotations)0x0;
  message_annotations_map = (AMQP_VALUE)message_annotations_length;
  message_annotations_length_local = (size_t *)message_annotations;
  message_annotations_local = (AMQP_VALUE *)messageHandle;
  iVar1 = create_diagnostic_message_annotations(messageHandle,&stack0xffffffffffffffd8);
  if (iVar1 == 0) {
    iVar1 = create_security_message_annotations
                      ((IOTHUB_MESSAGE_HANDLE)message_annotations_local,&stack0xffffffffffffffd8);
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"create_message_annotations_to_encode",0x241,1,
                  "Failed creating message annotations");
      }
      l._4_4_ = 0x242;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"create_message_annotations_to_encode",0x23c,1,
                "Failed creating message annotations");
    }
    l._4_4_ = 0x23d;
  }
  if (pAStack_28 != (message_annotations)0x0) {
    if (l._4_4_ == 0) {
      pAVar3 = amqpvalue_create_message_annotations(pAStack_28);
      *message_annotations_length_local = (size_t)pAVar3;
      if (pAVar3 == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"create_message_annotations_to_encode",0x24e,1,
                    "Failed creating message annotations");
        }
        l._4_4_ = 0x24f;
      }
      else {
        iVar1 = amqpvalue_get_encoded_size
                          ((AMQP_VALUE)*message_annotations_length_local,
                           (size_t *)message_annotations_map);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"create_message_annotations_to_encode",0x253,1,
                      "Failed getting size of annotations");
          }
          l._4_4_ = 0x254;
        }
      }
    }
    amqpvalue_destroy(pAStack_28);
  }
  return l._4_4_;
}

Assistant:

static int create_message_annotations_to_encode(IOTHUB_MESSAGE_HANDLE messageHandle, AMQP_VALUE *message_annotations, size_t *message_annotations_length)
{
    AMQP_VALUE message_annotations_map = NULL;
    int result;

    if ((result = create_diagnostic_message_annotations(messageHandle, &message_annotations_map)) != RESULT_OK)
    {
        LogError("Failed creating message annotations");
        result = MU_FAILURE;
    }
    else if ((result = create_security_message_annotations(messageHandle, &message_annotations_map)) != RESULT_OK)
    {
        LogError("Failed creating message annotations");
        result = MU_FAILURE;
    }
    else
    {
        result = RESULT_OK;
    }
    if (message_annotations_map != NULL)
    {
        if (result == RESULT_OK)
        {
            if ((*message_annotations = amqpvalue_create_message_annotations(message_annotations_map)) == NULL)
            {
                LogError("Failed creating message annotations");
                result = MU_FAILURE;
            }
            else if (amqpvalue_get_encoded_size(*message_annotations, message_annotations_length) != 0)
            {
                LogError("Failed getting size of annotations");
                result = MU_FAILURE;
            }
        }
        amqpvalue_destroy(message_annotations_map);
    }
    return result;
}